

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O3

QByteArray * __thiscall
QHttpNetworkRequest::uri
          (QByteArray *__return_storage_ptr__,QHttpNetworkRequest *this,bool throughProxy)

{
  QHttpNetworkRequestPrivate *pQVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  QUrl copy;
  QArrayData *local_50;
  char16_t *local_48;
  long local_40;
  QUrl local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  uVar3 = 0x1f00086;
  if (pQVar1->operation == Post) {
    uVar3 = (uint)(pQVar1->uploadByteDevice == (QNonContiguousByteDevice *)0x0) << 6 | 0x1f00086;
  }
  uVar4 = uVar3 | 0x1f;
  if (throughProxy) {
    uVar4 = uVar3;
  }
  local_38.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_38,&(pQVar1->super_QHttpNetworkHeaderPrivate).url);
  QUrl::path(&local_50,&local_38,0x7f00000);
  lVar2 = local_40;
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  if (lVar2 == 0) {
    local_50 = (QArrayData *)0x0;
    local_48 = L"/";
    local_40 = 1;
    QUrl::setPath((QString *)&local_38,(ParsingMode)&local_50);
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,2,0x10);
      }
    }
  }
  else {
    uVar4 = uVar4 | 0x1000;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  QUrl::toEncoded(__return_storage_ptr__,&local_38,uVar4);
  QUrl::~QUrl(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QHttpNetworkRequest::uri(bool throughProxy) const
{
    QUrl::FormattingOptions format(QUrl::RemoveFragment | QUrl::RemoveUserInfo | QUrl::FullyEncoded);

    // for POST, query data is sent as content
    if (d->operation == QHttpNetworkRequest::Post && !d->uploadByteDevice)
        format |= QUrl::RemoveQuery;
    // for requests through proxy, the Request-URI contains full url
    if (!throughProxy)
        format |= QUrl::RemoveScheme | QUrl::RemoveAuthority;
    QUrl copy = d->url;
    if (copy.path().isEmpty())
        copy.setPath(QStringLiteral("/"));
    else
        format |= QUrl::NormalizePathSegments;
    QByteArray uri = copy.toEncoded(format);
    return uri;
}